

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O2

bsc_step_t
bsc_reduce_qtree_single
          (bsc_step_t depends,bsc_pid_t root,bsc_group_t group,void *src,void *dst,void *tmp_space,
          bsc_reduce_t reducer,void *zero,bsc_size_t nmemb,bsc_size_t size,bsc_pid_t q)

{
  long lVar1;
  bsp_pid_t bVar2;
  int iVar3;
  uint uVar4;
  void *pvVar5;
  int iVar6;
  bsc_pid_t src_pid;
  void *a;
  int iVar7;
  int iVar8;
  int iVar9;
  bsc_step_t local_5c;
  
  if (group == (bsc_group_t)0x0) {
    iVar3 = bsp_nprocs();
    iVar6 = bsp_pid();
  }
  else {
    iVar3 = *group;
    lVar1 = *(long *)((long)group + 8);
    root = *(int *)(lVar1 + (long)root * 4);
    bVar2 = bsp_pid();
    iVar6 = *(int *)(lVar1 + (long)bVar2 * 4);
  }
  iVar6 = ((iVar3 - root) + iVar6) % iVar3;
  pvVar5 = tmp_space;
  if (iVar3 == 1) {
    pvVar5 = dst;
  }
  (*reducer)(pvVar5,zero,src,nmemb * size);
  local_5c = depends;
  if (iVar3 != 1) {
    pvVar5 = (void *)((long)size + (long)tmp_space);
    uVar4 = int_log(q,iVar3 - 1);
    for (uVar4 = int_pow(q,uVar4); 0 < (int)uVar4; uVar4 = (int)uVar4 / q) {
      if (iVar6 < (int)uVar4) {
        iVar8 = 1;
        iVar7 = 1;
        iVar9 = iVar6;
        while( true ) {
          iVar9 = iVar9 + uVar4;
          if (q <= iVar8) break;
          if (iVar9 < iVar3) {
            src_pid = (root + iVar9) % iVar3;
            if (group != (bsc_group_t)0x0) {
              src_pid = *(bsc_pid_t *)(*(long *)((long)group + 0x10) + (long)src_pid * 4);
            }
            bsc_get(local_5c,src_pid,tmp_space,0,(void *)((long)(iVar7 * size) + (long)pvVar5),size)
            ;
            iVar7 = iVar7 + 1;
          }
          iVar8 = iVar8 + 1;
        }
        bVar2 = bsp_pid();
        bsc_get(local_5c,bVar2,tmp_space,0,pvVar5,size);
        a = tmp_space;
        if (uVar4 == 1) {
          a = dst;
        }
        bsc_exec_reduce(local_5c,reducer,a,zero,pvVar5,iVar7 * size);
      }
      local_5c = local_5c + 1;
    }
  }
  return local_5c;
}

Assistant:

DLL_PUBLIC bsc_step_t bsc_reduce_qtree_single( bsc_step_t depends, 
        bsc_pid_t root, bsc_group_t group,
        const void * src, void * dst, void * tmp_space,
        bsc_reduce_t reducer, const void * zero,
        bsc_size_t nmemb, bsc_size_t size, bsc_pid_t q )
{
    const group_t * g = group;
    bsc_pid_t i, j, k, P = g?g->size:bsp_nprocs() ;
    bsc_pid_t range, r = g?g->lid[root]:root;
    bsc_pid_t me = ((g?g->lid[ bsp_pid() ] : bsp_pid()) + P - r) %P;
    char * tmp_bytes = tmp_space;
    void * accum = tmp_bytes;
    char * gather = tmp_bytes + size;

    (*reducer)( P==1?dst:accum, zero, src, size * nmemb );
    if (P == 1) {
        return depends;
    }
    
    for (range = int_pow( q, int_log( q, P-1));
            range >= 1; range /= q ) {
        if ( me < range ) {
            k = 1;
            for ( i = 1 ; i < q; ++i) {
                j = i * range + me; 
                if (j < P) {
                    j = (j + r )% P;
                    bsc_get( depends, g?g->gid[j]:j, accum, 0, 
                            &gather[k*size], size );
                    k += 1;
                }
            }
            bsc_get( depends, bsp_pid(), accum, 0, &gather[0], size );
            bsc_exec_reduce( depends, reducer, 
                    range==1?dst:accum, zero, gather, size * k );
        }
        depends += 1;
    }
    return depends;

}